

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_Io * memoryIo_duplicate(PHYSFS_Io *io)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *__s;
  PHYSFS_Io *retval;
  PHYSFS_Io *parent;
  MemoryIoInfo *newinfo;
  MemoryIoInfo *info;
  PHYSFS_Io *io_local;
  
  puVar1 = (undefined8 *)io->opaque;
  lVar2 = puVar1[3];
  if ((lVar2 != 0) && (*(long *)(*(long *)(lVar2 + 8) + 0x18) != 0)) {
    __assert_fail("(!parent) || (!((MemoryIoInfo *) parent->opaque)->parent)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                  ,0x133,"PHYSFS_Io *memoryIo_duplicate(PHYSFS_Io *)");
  }
  if (lVar2 == 0) {
    io_local = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
    if (io_local == (PHYSFS_Io *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      io_local = (PHYSFS_Io *)0x0;
    }
    else {
      __s = (undefined8 *)(*__PHYSFS_AllocatorHooks.Malloc)(0x30);
      if (__s == (undefined8 *)0x0) {
        (*__PHYSFS_AllocatorHooks.Free)(io_local);
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        io_local = (PHYSFS_Io *)0x0;
      }
      else {
        LOCK();
        *(int *)(puVar1 + 4) = *(int *)(puVar1 + 4) + 1;
        UNLOCK();
        memset(__s,0,0x30);
        *__s = *puVar1;
        __s[1] = puVar1[1];
        __s[2] = 0;
        __s[3] = io;
        *(undefined4 *)(__s + 4) = 0;
        __s[5] = 0;
        memcpy(io_local,io,0x50);
        io_local->opaque = __s;
      }
    }
  }
  else {
    io_local = (PHYSFS_Io *)(**(code **)(lVar2 + 0x38))(lVar2);
  }
  return io_local;
}

Assistant:

static PHYSFS_Io *memoryIo_duplicate(PHYSFS_Io *io)
{
    MemoryIoInfo *info = (MemoryIoInfo *) io->opaque;
    MemoryIoInfo *newinfo = NULL;
    PHYSFS_Io *parent = info->parent;
    PHYSFS_Io *retval = NULL;

    /* avoid deep copies. */
    assert((!parent) || (!((MemoryIoInfo *) parent->opaque)->parent) );

    /* share the buffer between duplicates. */
    if (parent != NULL)  /* dup the parent, increment its refcount. */
        return parent->duplicate(parent);

    /* we're the parent. */

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    BAIL_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    newinfo = (MemoryIoInfo *) allocator.Malloc(sizeof (MemoryIoInfo));
    if (!newinfo)
    {
        allocator.Free(retval);
        BAIL(PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    } /* if */

    __PHYSFS_ATOMIC_INCR(&info->refcount);

    memset(newinfo, '\0', sizeof (*info));
    newinfo->buf = info->buf;
    newinfo->len = info->len;
    newinfo->pos = 0;
    newinfo->parent = io;
    newinfo->refcount = 0;
    newinfo->destruct = NULL;

    memcpy(retval, io, sizeof (*retval));
    retval->opaque = newinfo;
    return retval;
}